

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

size_t __thiscall utf8_ptr::setwcharsz(utf8_ptr *this,wchar_t *src,size_t bufsiz)

{
  wchar_t ch;
  ulong uVar1;
  size_t sVar2;
  
  sVar2 = 0;
  for (; ch = *src, ch != L'\0'; src = src + 1) {
    uVar1 = 3 - (ulong)((uint)ch < 0x800);
    if (ch < L'\x80') {
      uVar1 = 1;
    }
    sVar2 = sVar2 + uVar1;
    if (bufsiz < uVar1) {
      bufsiz = 0;
    }
    else {
      setch(this,ch);
      bufsiz = bufsiz - sVar2;
    }
  }
  return sVar2;
}

Assistant:

size_t utf8_ptr::setwcharsz(const wchar_t *src, size_t bufsiz)
{
    /* loop through the source and store the characters */
    size_t outbytes;
    for (outbytes = 0 ; *src != 0 ; ++src)
    {
        /* figure out how many bytes we need for this character */
        size_t curbytes = s_wchar_size(*src);

        /* add it to the total output size */
        outbytes += curbytes;

        /* if we have room, add it to the buffer */
        if (bufsiz >= curbytes)
        {
            /* store it */
            setch(*src);

            /* deduct this space from the remaining buffer size */
            bufsiz -= outbytes;
        }
        else
        {
            /* 
             *   there's no room for this - make sure we don't store
             *   anything more (since we might have room for a shorter
             *   character later, but that would put a gap in the output
             *   string - better to just truncate here) 
             */
            bufsiz = 0;
        }
    }

    /* return the total output size used (or needed) */
    return outbytes;
}